

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void * phmap::priv::Allocate<8ul,std::allocator<std::tuple<float,std::__cxx11::string>>>
                 (allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *alloc,size_t n)

{
  pointer pMVar1;
  void *p;
  size_t sStack_18;
  A mem_alloc;
  size_t n_local;
  allocator<std::tuple<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *alloc_local;
  
  sStack_18 = n;
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x105d,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::tuple<float, std::basic_string<char>>>]"
                 );
  }
  std::
  allocator<phmap::priv::Allocate<8ul,std::allocator<std::tuple<float,std::__cxx11::string>>>(std::allocator<std::tuple<float,std::__cxx11::string>>*,unsigned_long)::M>
  ::allocator<std::tuple<float,std::__cxx11::string>>
            ((allocator<phmap::priv::Allocate<8ul,std::allocator<std::tuple<float,std::__cxx11::string>>>(std::allocator<std::tuple<float,std::__cxx11::string>>*,unsigned_long)::M>
              *)((long)&p + 7),alloc);
  pMVar1 = allocator_traits<std::allocator<M>_>::allocate
                     ((allocator<M> *)((long)&p + 7),sStack_18 + 7 >> 3);
  if (((ulong)pMVar1 & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x1064,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::tuple<float, std::basic_string<char>>>]"
                 );
  }
  std::allocator<M>::~allocator((allocator<M> *)((long)&p + 7));
  return pMVar1;
}

Assistant:

void* Allocate(Alloc* alloc, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  void* p = &*AT::allocate(mem_alloc, (n + sizeof(M) - 1) / sizeof(M)); // `&*` to support custom pointers such as boost offset_ptr.
  assert(reinterpret_cast<uintptr_t>(p) % Alignment == 0 &&
         "allocator does not respect alignment");
  return p;
}